

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

Class * __thiscall r_code::vector<r_comp::Class>::operator[](vector<r_comp::Class> *this,size_t i)

{
  size_t sVar1;
  reference pvVar2;
  size_t i_local;
  vector<r_comp::Class> *this_local;
  
  sVar1 = size(this);
  if (sVar1 <= i) {
    std::vector<r_comp::Class,_std::allocator<r_comp::Class>_>::resize(&this->m_vector,i + 1);
  }
  pvVar2 = std::vector<r_comp::Class,_std::allocator<r_comp::Class>_>::at(&this->m_vector,i);
  return pvVar2;
}

Assistant:

T &operator [](size_t i)
    {
        if (i >= size()) {
            m_vector.resize(i + 1);
        }

        return m_vector.at(i);
    }